

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddTriangle(ImDrawList *this,ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImU32 col,float thickness)

{
  ImDrawList *in_RCX;
  ImDrawList *in_RDI;
  uint in_R8D;
  ImDrawFlags in_XMM0_Da;
  ImVec2 *in_stack_ffffffffffffffc8;
  
  if ((in_R8D & 0xff000000) != 0) {
    PathLineTo(in_RDI,in_stack_ffffffffffffffc8);
    PathLineTo(in_RDI,in_stack_ffffffffffffffc8);
    PathLineTo(in_RDI,in_stack_ffffffffffffffc8);
    PathStroke(in_RCX,in_R8D,in_XMM0_Da,(float)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void ImDrawList::AddTriangle(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, ImU32 col, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(p1);
    PathLineTo(p2);
    PathLineTo(p3);
    PathStroke(col, ImDrawFlags_Closed, thickness);
}